

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O2

type dlib::
     matrix_assign_default<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::column_major_layout>,dlib::matrix_exp<dlib::matrix_op<dlib::op_rowm_range<dlib::matrix_diag_op<dlib::op_identity_matrix_2<float>>,dlib::matrix<long,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
               (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>
                *dest,matrix_exp<dlib::matrix_op<dlib::op_rowm_range<dlib::matrix_diag_op<dlib::op_identity_matrix_2<float>_>,_dlib::matrix<long,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>
                      *src)

{
  ulong uVar1;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = **(ulong **)src;
  lVar6 = 0;
  for (uVar7 = 0; uVar7 != (~((long)uVar1 >> 0x3f) & uVar1); uVar7 = uVar7 + 1) {
    plVar2 = *(long **)(src + 8);
    uVar3 = plVar2[1];
    lVar4 = (dest->data).nr_;
    pfVar5 = (dest->data).data;
    for (uVar8 = 0; (~((long)uVar3 >> 0x3f) & uVar3) != uVar8; uVar8 = uVar8 + 1) {
      *(uint *)((long)pfVar5 + uVar8 * 4 + lVar4 * lVar6) =
           (uint)(*(ulong *)(*plVar2 + uVar8 * 8) == uVar7) * 0x3f800000;
    }
    lVar6 = lVar6 + 4;
  }
  return;
}

Assistant:

inline typename enable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - #dest == src
    !*/
    {
        for (long c = 0; c < src.nc(); ++c)
        {
            for (long r = 0; r < src.nr(); ++r)
            {
                dest(r,c) = src(r,c);
            }
        }
    }